

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

bool kratos::is_reduction_op(ExprOp op)

{
  int iVar1;
  iterator iVar2;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined1 local_28 [8];
  ExprOp local_20;
  ExprOp op_local;
  
  local_20 = op;
  if (is_reduction_op(kratos::ExprOp)::ops == '\0') {
    iVar1 = __cxa_guard_acquire(&is_reduction_op(kratos::ExprOp)::ops);
    if (iVar1 != 0) {
      local_38 = 5;
      uStack_30 = 4;
      local_48 = 3;
      uStack_44 = 0;
      uStack_40 = 6;
      uStack_3c = 0;
      std::
      _Hashtable<kratos::ExprOp,kratos::ExprOp,std::allocator<kratos::ExprOp>,std::__detail::_Identity,std::equal_to<kratos::ExprOp>,std::hash<kratos::ExprOp>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::_Hashtable<kratos::ExprOp_const*>
                ((_Hashtable<kratos::ExprOp,kratos::ExprOp,std::allocator<kratos::ExprOp>,std::__detail::_Identity,std::equal_to<kratos::ExprOp>,std::hash<kratos::ExprOp>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&is_reduction_op::ops,&local_48,local_28,0,(byte *)((long)&op_local + 5),
                 (byte *)((long)&op_local + 6),(byte *)((long)&op_local + 7));
      __cxa_atexit(std::
                   unordered_set<kratos::ExprOp,_std::hash<kratos::ExprOp>,_std::equal_to<kratos::ExprOp>,_std::allocator<kratos::ExprOp>_>
                   ::~unordered_set,&is_reduction_op::ops,&__dso_handle);
      __cxa_guard_release(&is_reduction_op(kratos::ExprOp)::ops);
    }
  }
  iVar2 = std::
          _Hashtable<kratos::ExprOp,_kratos::ExprOp,_std::allocator<kratos::ExprOp>,_std::__detail::_Identity,_std::equal_to<kratos::ExprOp>,_std::hash<kratos::ExprOp>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&is_reduction_op::ops._M_h,&local_20);
  return iVar2.super__Node_iterator_base<kratos::ExprOp,_false>._M_cur != (__node_type *)0x0;
}

Assistant:

bool is_reduction_op(ExprOp op) {
    static std::unordered_set<ExprOp> ops = {ExprOp::UOr, ExprOp::UXor, ExprOp::UAnd, ExprOp::UNot};
    return ops.find(op) != ops.end();
}